

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_count_scanner.cpp
# Opt level: O1

bool duckdb::ColumnCountResult::AddRow(ColumnCountResult *result,idx_t buffer_pos)

{
  LinePosition *pLVar1;
  vector<duckdb::ColumnCount,_true> *this;
  idx_t iVar2;
  idx_t iVar3;
  CSVReaderOptions *this_00;
  CSVStates *pCVar4;
  ulong uVar5;
  reference pvVar6;
  mapped_type_conflict *pmVar7;
  pointer pcVar8;
  idx_t iVar9;
  LinesPerBoundary error_info;
  bool mock;
  string csv_row;
  LinesPerBoundary lines_per_batch;
  CSVError error;
  undefined7 in_stack_fffffffffffffed0;
  bool bVar10;
  string local_128;
  LinesPerBoundary local_108;
  CSVError local_f8;
  FullLinePosition local_68;
  
  iVar2 = result->cur_buffer_idx;
  iVar9 = buffer_pos + 1;
  pLVar1 = &(result->super_ScannerResult).last_position;
  if ((result->super_ScannerResult).last_position.buffer_idx == iVar2) {
    uVar5 = iVar9 - pLVar1->buffer_pos;
  }
  else {
    uVar5 = ((result->super_ScannerResult).last_position.buffer_size + iVar9) -
            (result->super_ScannerResult).last_position.buffer_pos;
  }
  iVar3 = result->current_buffer_size;
  if ((buffer_pos != 0xffffffffffffffff) &&
     ((((result->super_ScannerResult).state_machine)->options->maximum_line_size).value < uVar5)) {
    LinesPerBoundary::LinesPerBoundary(&local_108);
    local_68.begin.buffer_pos = pLVar1->buffer_pos;
    local_68.begin.buffer_size = (result->super_ScannerResult).last_position.buffer_size;
    local_68.begin.buffer_idx = (result->super_ScannerResult).last_position.buffer_idx;
    bVar10 = false;
    local_68.end.buffer_pos = iVar9;
    local_68.end.buffer_size = iVar3;
    local_68.end.buffer_idx = iVar2;
    FullLinePosition::
    ReconstructCurrentLine<std::map<unsigned_long,duckdb::shared_ptr<duckdb::CSVBufferHandle,true>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,duckdb::shared_ptr<duckdb::CSVBufferHandle,true>>>>>
              (&local_128,&local_68,(bool *)&stack0xfffffffffffffed7,&result->buffer_handles,true);
    this_00 = ((result->super_ScannerResult).state_machine)->options;
    error_info.lines_in_batch = (idx_t)&local_128;
    error_info.boundary_idx = local_108.lines_in_batch;
    CSVError::LineSizeError
              (&local_f8,(CSVError *)this_00,(CSVReaderOptions *)local_108.boundary_idx,error_info,
               (string *)
               ((result->super_ScannerResult).last_position.buffer_idx *
                (this_00->buffer_size_option).value +
               (result->super_ScannerResult).last_position.buffer_pos),(idx_t)&this_00->file_path,
               (string *)CONCAT17(bVar10,in_stack_fffffffffffffed0));
    CSVErrorHandler::Error(result->error_handler,&local_f8,false);
    result->error = true;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8.csv_row._M_dataplus._M_p != &local_f8.csv_row.field_2) {
      operator_delete(local_f8.csv_row._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8.full_error_message._M_dataplus._M_p != &local_f8.full_error_message.field_2) {
      operator_delete(local_f8.full_error_message._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8.error_message._M_dataplus._M_p != &local_f8.error_message.field_2) {
      operator_delete(local_f8.error_message._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p);
    }
  }
  pcVar8 = (pointer)(result->current_column_count + 1);
  this = &result->column_counts;
  local_f8.error_message._M_dataplus._M_p = pcVar8;
  pvVar6 = vector<duckdb::ColumnCount,_true>::operator[](this,result->result_position);
  pvVar6->number_of_columns = (idx_t)pcVar8;
  pmVar7 = ::std::
           map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
           ::operator[](&result->rows_per_column_count,(key_type *)&local_f8);
  *pmVar7 = *pmVar7 + 1;
  result->current_column_count = 0;
  (result->super_ScannerResult).last_position.buffer_pos = iVar9;
  (result->super_ScannerResult).last_position.buffer_size = iVar3;
  (result->super_ScannerResult).last_position.buffer_idx = iVar2;
  pCVar4 = (result->super_ScannerResult).states;
  if (pCVar4->states[0] == STANDARD) {
    iVar9 = result->result_position;
    if (iVar9 == 0xffffffffffffffff || pCVar4->states[1] == DELIMITER) goto LAB_01815d0f;
  }
  else if ((((pCVar4->states[0] == DELIMITER) && (pCVar4->states[1] < 7)) &&
           ((0x62U >> (pCVar4->states[1] & 0x1f) & 1) != 0)) ||
          (iVar9 = result->result_position, iVar9 == 0xffffffffffffffff)) goto LAB_01815d0f;
  uVar5 = 0;
  do {
    pvVar6 = vector<duckdb::ColumnCount,_true>::operator[](this,iVar9);
    if (pvVar6->last_value_always_empty != true) break;
    pvVar6 = vector<duckdb::ColumnCount,_true>::operator[](this,iVar9);
    pvVar6->last_value_always_empty = false;
    uVar5 = uVar5 + 1;
    iVar9 = iVar9 - 1;
  } while (uVar5 < result->result_position + 1);
LAB_01815d0f:
  uVar5 = result->result_position + 1;
  result->result_position = uVar5;
  return (result->super_ScannerResult).result_size <= uVar5;
}

Assistant:

bool ColumnCountResult::AddRow(ColumnCountResult &result, idx_t buffer_pos) {
	const LinePosition cur_position(result.cur_buffer_idx, buffer_pos + 1, result.current_buffer_size);
	if (cur_position - result.last_position > result.state_machine.options.maximum_line_size.GetValue() &&
	    buffer_pos != NumericLimits<idx_t>::Maximum()) {
		LinesPerBoundary lines_per_batch;
		FullLinePosition current_line_position;
		current_line_position.begin = result.last_position;
		current_line_position.end = cur_position;
		bool mock = false;
		string csv_row = current_line_position.ReconstructCurrentLine(mock, result.buffer_handles, true);
		auto error = CSVError::LineSizeError(
		    result.state_machine.options, lines_per_batch, csv_row,
		    result.last_position.GetGlobalPosition(result.state_machine.options.buffer_size_option.GetValue(), false),
		    result.state_machine.options.file_path);
		result.error_handler.Error(error);
		result.error = true;
	}
	result.InternalAddRow();
	result.last_position = cur_position;
	if (!result.states.EmptyLastValue()) {
		idx_t col_count_idx = result.result_position;
		for (idx_t i = 0; i < result.result_position + 1; i++) {
			if (!result.column_counts[col_count_idx].last_value_always_empty) {
				break;
			}
			result.column_counts[col_count_idx--].last_value_always_empty = false;
		}
	}
	result.result_position++;
	if (result.result_position >= result.result_size) {
		// We sniffed enough rows
		return true;
	}
	return false;
}